

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O3

int4 __thiscall
BlockCondition::flipInPlaceTest
          (BlockCondition *this,vector<PcodeOp_*,_std::allocator<PcodeOp_*>_> *fliplist)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar4;
  long *plVar5;
  
  iVar1 = (*(*(this->super_BlockGraph).list.
              super__Vector_base<FlowBlock_*,_std::allocator<FlowBlock_*>_>._M_impl.
              super__Vector_impl_data._M_start)->_vptr_FlowBlock[0x11])();
  plVar4 = (long *)CONCAT44(extraout_var,iVar1);
  iVar1 = 2;
  if (plVar4 != (long *)0x0) {
    iVar2 = (*(this->super_BlockGraph).list.
              super__Vector_base<FlowBlock_*,_std::allocator<FlowBlock_*>_>._M_impl.
              super__Vector_impl_data._M_start[1]->_vptr_FlowBlock[0x11])();
    plVar5 = (long *)CONCAT44(extraout_var_00,iVar2);
    if (((plVar5 != (long *)0x0) &&
        (iVar2 = (**(code **)(*plVar4 + 0x90))(plVar4,fliplist), iVar2 != 2)) &&
       (iVar3 = (**(code **)(*plVar5 + 0x90))(plVar5,fliplist), iVar1 = iVar2, iVar3 == 2)) {
      iVar1 = 2;
    }
  }
  return iVar1;
}

Assistant:

int4 BlockCondition::flipInPlaceTest(vector<PcodeOp *> &fliplist) const

{
  FlowBlock *split1 = getBlock(0)->getSplitPoint();
  if (split1 == (FlowBlock *)0)
    return 2;
  FlowBlock *split2 = getBlock(1)->getSplitPoint();
  if (split2 == (FlowBlock *)0)
    return 2;
  int4 subtest1 = split1->flipInPlaceTest(fliplist);
  if (subtest1 == 2)
    return 2;
  int4 subtest2 = split2->flipInPlaceTest(fliplist);
  if (subtest2 == 2)
    return 2;
  return subtest1;
}